

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::PluralFormat::format
          (PluralFormat *this,Formattable *numberObject,double number,UnicodeString *appendTo,
          FieldPosition *pos,UErrorCode *status)

{
  NumberFormat *this_00;
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  UMessagePatternPartType UVar4;
  undefined4 extraout_var;
  LocalizedNumberFormatter *this_01;
  UnicodeString *srcText;
  Part *pPVar5;
  DecimalFormat *local_2e8;
  int32_t index;
  UMessagePatternPartType type;
  Part *part;
  int32_t prevIndex;
  UnicodeString *pattern;
  undefined1 local_2a8 [4];
  int32_t partIndex;
  UnicodeString local_238;
  DecimalFormat *local_1f8;
  DecimalFormat *decFmt;
  UnicodeString numberString;
  undefined1 local_1a0 [8];
  UFormattedNumberData data;
  double numberMinusOffset;
  UErrorCode *status_local;
  FieldPosition *pos_local;
  UnicodeString *appendTo_local;
  double number_local;
  Formattable *numberObject_local;
  PluralFormat *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  this_local = (PluralFormat *)appendTo;
  if (UVar1 == '\0') {
    iVar2 = MessagePattern::countParts(&this->msgPattern);
    if (iVar2 == 0) {
      iVar3 = (*(this->numberFormat->super_Format).super_UObject._vptr_UObject[5])
                        (this->numberFormat,numberObject,appendTo,pos,status);
      this_local = (PluralFormat *)CONCAT44(extraout_var,iVar3);
    }
    else {
      data.string._248_8_ = number - this->offset;
      icu_63::number::impl::UFormattedNumberData::UFormattedNumberData
                ((UFormattedNumberData *)local_1a0);
      if ((this->offset != 0.0) || (NAN(this->offset))) {
        icu_63::number::impl::DecimalQuantity::setToDouble
                  ((DecimalQuantity *)&data,(double)data.string._248_8_);
      }
      else {
        Formattable::populateDecimalQuantity(numberObject,(DecimalQuantity *)&data,status);
      }
      UnicodeString::UnicodeString((UnicodeString *)&decFmt);
      if (this->numberFormat == (NumberFormat *)0x0) {
        local_2e8 = (DecimalFormat *)0x0;
      }
      else {
        local_2e8 = (DecimalFormat *)
                    __dynamic_cast(this->numberFormat,&NumberFormat::typeinfo,
                                   &DecimalFormat::typeinfo,0);
      }
      local_1f8 = local_2e8;
      if (local_2e8 == (DecimalFormat *)0x0) {
        if ((this->offset != 0.0) || (NAN(this->offset))) {
          this_00 = this->numberFormat;
          Formattable::Formattable((Formattable *)local_2a8,(double)data.string._248_8_);
          Format::format(&this_00->super_Format,(Formattable *)local_2a8,(UnicodeString *)&decFmt,
                         status);
          Formattable::~Formattable((Formattable *)local_2a8);
        }
        else {
          Format::format(&this->numberFormat->super_Format,numberObject,(UnicodeString *)&decFmt,
                         status);
        }
      }
      else {
        this_01 = DecimalFormat::toNumberFormatter(local_2e8);
        icu_63::number::LocalizedNumberFormatter::formatImpl
                  (this_01,(UFormattedNumberData *)local_1a0,status);
        icu_63::number::impl::NumberStringBuilder::toUnicodeString
                  (&local_238,(NumberStringBuilder *)&data.quantity.usingBytes);
        UnicodeString::operator=((UnicodeString *)&decFmt,&local_238);
        UnicodeString::~UnicodeString(&local_238);
      }
      pattern._4_4_ =
           findSubMessage(&this->msgPattern,0,&(this->pluralRulesWrapper).super_PluralSelector,&data
                          ,number,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        srcText = MessagePattern::getPatternString(&this->msgPattern);
        pPVar5 = MessagePattern::getPart(&this->msgPattern,pattern._4_4_);
        part._4_4_ = MessagePattern::Part::getLimit(pPVar5);
        while( true ) {
          pattern._4_4_ = pattern._4_4_ + 1;
          pPVar5 = MessagePattern::getPart(&this->msgPattern,pattern._4_4_);
          UVar4 = MessagePattern::Part::getType(pPVar5);
          iVar2 = MessagePattern::Part::getIndex(pPVar5);
          if (UVar4 == UMSGPAT_PART_TYPE_MSG_LIMIT) break;
          if ((UVar4 == UMSGPAT_PART_TYPE_REPLACE_NUMBER) ||
             ((UVar4 == UMSGPAT_PART_TYPE_SKIP_SYNTAX &&
              (UVar1 = MessageImpl::jdkAposMode(&this->msgPattern), UVar1 != '\0')))) {
            UnicodeString::append(appendTo,srcText,part._4_4_,iVar2 - part._4_4_);
            if (UVar4 == UMSGPAT_PART_TYPE_REPLACE_NUMBER) {
              UnicodeString::append(appendTo,(UnicodeString *)&decFmt);
            }
            part._4_4_ = MessagePattern::Part::getLimit(pPVar5);
          }
          else if (UVar4 == UMSGPAT_PART_TYPE_ARG_START) {
            UnicodeString::append(appendTo,srcText,part._4_4_,iVar2 - part._4_4_);
            pattern._4_4_ = MessagePattern::getLimitPartIndex(&this->msgPattern,pattern._4_4_);
            pPVar5 = MessagePattern::getPart(&this->msgPattern,pattern._4_4_);
            part._4_4_ = MessagePattern::Part::getLimit(pPVar5);
            MessageImpl::appendReducedApostrophes(srcText,iVar2,part._4_4_,appendTo);
          }
        }
        this_local = (PluralFormat *)
                     UnicodeString::append(appendTo,srcText,part._4_4_,iVar2 - part._4_4_);
      }
      UnicodeString::~UnicodeString((UnicodeString *)&decFmt);
      icu_63::number::impl::UFormattedNumberData::~UFormattedNumberData
                ((UFormattedNumberData *)local_1a0);
    }
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
PluralFormat::format(const Formattable& numberObject, double number,
                     UnicodeString& appendTo,
                     FieldPosition& pos,
                     UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return appendTo;
    }
    if (msgPattern.countParts() == 0) {
        return numberFormat->format(numberObject, appendTo, pos, status);
    }

    // Get the appropriate sub-message.
    // Select it based on the formatted number-offset.
    double numberMinusOffset = number - offset;
    // Call NumberFormatter to get both the DecimalQuantity and the string.
    // This call site needs to use more internal APIs than the Java equivalent.
    number::impl::UFormattedNumberData data;
    if (offset == 0) {
        // could be BigDecimal etc.
        numberObject.populateDecimalQuantity(data.quantity, status);
    } else {
        data.quantity.setToDouble(numberMinusOffset);
    }
    UnicodeString numberString;
    auto *decFmt = dynamic_cast<DecimalFormat *>(numberFormat);
    if(decFmt != nullptr) {
        decFmt->toNumberFormatter().formatImpl(&data, status); // mutates &data
        numberString = data.string.toUnicodeString();
    } else {
        if (offset == 0) {
            numberFormat->format(numberObject, numberString, status);
        } else {
            numberFormat->format(numberMinusOffset, numberString, status);
        }
    }

    int32_t partIndex = findSubMessage(msgPattern, 0, pluralRulesWrapper, &data.quantity, number, status);
    if (U_FAILURE(status)) { return appendTo; }
    // Replace syntactic # signs in the top level of this sub-message
    // (not in nested arguments) with the formatted number-offset.
    const UnicodeString& pattern = msgPattern.getPatternString();
    int32_t prevIndex = msgPattern.getPart(partIndex).getLimit();
    for (;;) {
        const MessagePattern::Part& part = msgPattern.getPart(++partIndex);
        const UMessagePatternPartType type = part.getType();
        int32_t index = part.getIndex();
        if (type == UMSGPAT_PART_TYPE_MSG_LIMIT) {
            return appendTo.append(pattern, prevIndex, index - prevIndex);
        } else if ((type == UMSGPAT_PART_TYPE_REPLACE_NUMBER) ||
            (type == UMSGPAT_PART_TYPE_SKIP_SYNTAX && MessageImpl::jdkAposMode(msgPattern))) {
            appendTo.append(pattern, prevIndex, index - prevIndex);
            if (type == UMSGPAT_PART_TYPE_REPLACE_NUMBER) {
                appendTo.append(numberString);
            }
            prevIndex = part.getLimit();
        } else if (type == UMSGPAT_PART_TYPE_ARG_START) {
            appendTo.append(pattern, prevIndex, index - prevIndex);
            prevIndex = index;
            partIndex = msgPattern.getLimitPartIndex(partIndex);
            index = msgPattern.getPart(partIndex).getLimit();
            MessageImpl::appendReducedApostrophes(pattern, prevIndex, index, appendTo);
            prevIndex = index;
        }
    }
}